

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guid_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::GUIDTest_test_new_guid_differ_Test::TestBody
          (GUIDTest_test_new_guid_differ_Test *this)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  GUID guid5;
  GUID guid4;
  GUID guid3;
  GUID guid2;
  GUID guid1;
  GUID guid0;
  
  iVar3 = 0x3e9;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      return;
    }
    bidfx_public_api::tools::GUID::GUID(&guid0);
    bidfx_public_api::tools::GUID::GUID(&guid1);
    bidfx_public_api::tools::GUID::GUID(&guid2);
    bidfx_public_api::tools::GUID::GUID(&guid3);
    bidfx_public_api::tools::GUID::GUID(&guid4);
    bidfx_public_api::tools::GUID::GUID(&guid5);
    bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
    bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
    testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,"guid0.ToString()","guid1.ToString()",&local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_b0);
      pcVar1 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                 ,0x21,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b0);
LAB_001bddb3:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      cVar2 = '\0';
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"guid0.ToString()","guid2.ToString()",&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b0);
        pcVar1 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x22,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b0);
        goto LAB_001bddb3;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"guid0.ToString()","guid3.ToString()",&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b0);
        pcVar1 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x23,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b0);
        goto LAB_001bddb3;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"guid0.ToString()","guid4.ToString()",&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b0);
        pcVar1 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x24,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b0);
        goto LAB_001bddb3;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"guid0.ToString()","guid5.ToString()",&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      cVar2 = gtest_ar.success_;
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b0);
        pcVar1 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x25,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_b0);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    bidfx_public_api::tools::GUID::~GUID(&guid5);
    bidfx_public_api::tools::GUID::~GUID(&guid4);
    bidfx_public_api::tools::GUID::~GUID(&guid3);
    bidfx_public_api::tools::GUID::~GUID(&guid2);
    bidfx_public_api::tools::GUID::~GUID(&guid1);
    bidfx_public_api::tools::GUID::~GUID(&guid0);
    if (cVar2 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

TEST_F(GUIDTest, test_new_guid_differ)
{
    for (int it = 0; it < 1000; it++)
    {
        GUID guid0;
        GUID guid1;
        GUID guid2;
        GUID guid3;
        GUID guid4;
        GUID guid5;
        ASSERT_NE(guid0.ToString(), guid1.ToString());
        ASSERT_NE(guid0.ToString(), guid2.ToString());
        ASSERT_NE(guid0.ToString(), guid3.ToString());
        ASSERT_NE(guid0.ToString(), guid4.ToString());
        ASSERT_NE(guid0.ToString(), guid5.ToString());
    }
}